

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O3

size_type __thiscall
itlib::
flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
::erase<Rml::Element*>
          (flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
           *this,Element **k)

{
  Element **__src;
  iterator __dest;
  size_type sVar1;
  Element **ppEVar2;
  
  __dest = find<Rml::Element*>(this,k);
  ppEVar2 = *(Element ***)(this + 8);
  if (__dest._M_current == ppEVar2) {
    sVar1 = 0;
  }
  else {
    __src = __dest._M_current + 1;
    if (__src != ppEVar2) {
      memmove(__dest._M_current,__src,(long)ppEVar2 - (long)__src);
      ppEVar2 = *(Element ***)(this + 8);
    }
    *(Element ***)(this + 8) = ppEVar2 + -1;
    sVar1 = 1;
  }
  return sVar1;
}

Assistant:

size_type erase(const F& k)
    {
        auto i = find(k);
        if (i == end())
        {
            return 0;
        }

        erase(i);
        return 1;
    }